

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsOutput::external(SmodelsOutput *this,Atom_t a,Value_t t)

{
  ostream *poVar1;
  
  if (this->ext_ != false) {
    if (t.val_ == Release) {
      std::ostream::operator<<((ostream *)this->os_,0x5c);
      poVar1 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    }
    else {
      std::ostream::operator<<((ostream *)this->os_,0x5b);
      poVar1 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    }
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
    return;
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::external(Atom_t, Value_t)",0x15b,"ext_",
       "external directive not supported in smodels format",0);
}

Assistant:

void SmodelsOutput::external(Atom_t a, Value_t t) {
	POTASSCO_REQUIRE(ext_, "external directive not supported in smodels format");
	if (t != Value_t::Release) {
		startRule(ClaspAssignExt).add(a).add((unsigned(t)^3)-1).endRule();
	}
	else {
		startRule(ClaspReleaseExt).add(a).endRule();
	}
}